

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_hash.h
# Opt level: O0

void duckdb_brotli::InitializeH35(HasherCommon *common,H35 *self,BrotliEncoderParams *params)

{
  undefined8 in_RDX;
  long in_RSI;
  undefined8 in_RDI;
  
  *(undefined8 *)(in_RSI + 0xd8) = in_RDI;
  memcpy((void *)(in_RSI + 0x38),*(void **)(in_RSI + 0xd8),0x50);
  memcpy((void *)(in_RSI + 0x88),*(void **)(in_RSI + 0xd8),0x50);
  *(undefined4 *)(in_RSI + 0xe0) = 1;
  *(undefined8 *)(in_RSI + 0xe8) = in_RDX;
  return;
}

Assistant:

static void FN(Initialize)(HasherCommon* common,
    HashComposite* BROTLI_RESTRICT self, const BrotliEncoderParams* params) {
  self->common = common;

  self->ha_common = *self->common;
  self->hb_common = *self->common;
  self->fresh = BROTLI_TRUE;
  self->params = params;
  /* TODO(lode): Initialize of the hashers is deferred to Prepare (and params
     remembered here) because we don't get the one_shot and input_size params
     here that are needed to know the memory size of them. Instead provide
     those params to all hashers FN(Initialize) */
}